

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTaskIIF::execute(LineBufferTaskIIF *this)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  LineBuffer *pLVar4;
  Data *pDVar5;
  unsigned_long uVar6;
  pointer psVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  unsigned_short uVar14;
  unsigned_short uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  int iVar50;
  undefined4 uVar51;
  uint uVar52;
  size_t sVar53;
  LogicExc *this_00;
  size_t sVar54;
  long lVar55;
  uint uVar56;
  int iVar57;
  uint y;
  long lVar58;
  long lVar59;
  unsigned_short *puVar60;
  ulong uVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined2 uVar80;
  undefined2 uVar81;
  undefined1 auVar72 [16];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined4 uVar106;
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [12];
  undefined1 auVar132 [12];
  undefined1 auVar133 [12];
  undefined1 auVar134 [12];
  undefined1 auVar135 [12];
  undefined1 auVar136 [12];
  undefined1 auVar137 [12];
  undefined1 auVar138 [12];
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  size_t pixelsToCopySSE;
  size_t pixelsToCopyNormal;
  undefined1 (*local_c8) [16];
  unsigned_short *local_c0;
  undefined1 (*local_b8) [16];
  unsigned_short *local_b0;
  undefined1 (*local_a8) [16];
  unsigned_short *local_a0;
  undefined1 (*local_98) [16];
  undefined2 *local_90;
  unsigned_short *local_80;
  unsigned_short *local_78;
  size_t local_70;
  LineBufferTaskIIF *local_68;
  size_t local_60;
  long local_58;
  int local_50;
  uint local_4c;
  pointer local_48;
  pointer local_40;
  ulong local_38;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [12];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar188 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  
  pLVar4 = this->_lineBuffer;
  local_68 = this;
  if ((pLVar4->buffer)._size == 0) {
    pDVar5 = this->_ifd;
    iVar50 = *(int *)((long)&pLVar4->dataPtr + 4);
    iVar57 = pLVar4->dataSize;
    if (pDVar5->maxY < pLVar4->dataSize) {
      iVar57 = pDVar5->maxY;
    }
    if (iVar57 < iVar50) {
      uVar61 = 0;
    }
    else {
      lVar55 = (long)(iVar50 - pDVar5->minY) + -1;
      uVar61 = 0;
      do {
        uVar61 = uVar61 + (pDVar5->bytesPerLine).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar55 + 1];
        lVar55 = lVar55 + 1;
      } while (lVar55 < iVar57 - pDVar5->minY);
    }
    if (((long *)pLVar4->endOfLineBufferData == (long *)0x0) ||
       (uVar61 <= (ulong)(long)*(int *)&pLVar4->dataPtr)) {
      pLVar4->minY = 1;
      (pLVar4->buffer)._size = (long)(pLVar4->buffer)._data;
    }
    else {
      iVar50 = (**(code **)(*(long *)pLVar4->endOfLineBufferData + 0x18))();
      pLVar4 = this->_lineBuffer;
      pLVar4->minY = iVar50;
      uVar51 = (**(code **)(*(long *)pLVar4->endOfLineBufferData + 0x30))
                         (pLVar4->endOfLineBufferData,(pLVar4->buffer)._data,
                          *(undefined4 *)&pLVar4->dataPtr,
                          *(undefined4 *)((long)&pLVar4->dataPtr + 4));
      *(undefined4 *)&this->_lineBuffer->dataPtr = uVar51;
    }
  }
  local_4c = this->_scanLineMax + 1;
  y = this->_scanLineMin;
  uVar56 = y - 1;
  bVar62 = this->_ifd->lineOrder == INCREASING_Y;
  if (!bVar62) {
    y = this->_scanLineMax;
    local_4c = uVar56;
  }
  if (y != local_4c) {
    iVar50 = (uint)bVar62 * 2 + -1;
    local_50 = iVar50;
    uVar56 = local_4c;
    do {
      local_38 = (ulong)y;
      uVar3 = (this->_optimizationMode)._ySampling;
      if ((int)y < 0) {
        if (-1 < (int)uVar3) {
          uVar52 = (~y + uVar3) / uVar3;
          goto LAB_001ddc9f;
        }
        uVar52 = (~uVar3 - y) / -uVar3;
      }
      else if ((int)uVar3 < 0) {
        uVar52 = y / -uVar3;
LAB_001ddc9f:
        uVar52 = -uVar52;
      }
      else {
        uVar52 = y / uVar3;
      }
      if (y == uVar52 * uVar3) {
        pDVar5 = this->_ifd;
        lVar55 = (this->_lineBuffer->buffer)._size;
        uVar6 = (pDVar5->offsetInLineBuffer).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)(int)y - (long)pDVar5->minY];
        local_70 = 0;
        local_60 = 0;
        local_78 = (unsigned_short *)0x0;
        local_80 = (unsigned_short *)0x0;
        local_40 = (pDVar5->optimizationData).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_48 = (pDVar5->optimizationData).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_58 = (long)local_48 - (long)local_40;
        uVar61 = (local_58 >> 3) * 0x6db6db6db6db6db7;
        if (uVar61 < 5) {
          getWritePointer<half>(this,y,&local_80,&local_70,&local_60,0);
          puVar60 = local_80;
        }
        else {
          getWritePointer<half>(this,y,&local_80,&local_70,&local_60,0);
          puVar60 = local_80;
          if (local_80 == (unsigned_short *)0x0) {
            puVar60 = (unsigned_short *)0x0;
          }
          else {
            getWritePointer<half>(this,y,&local_78,&local_70,&local_60,1);
          }
        }
        sVar53 = local_60;
        sVar54 = local_70;
        if ((puVar60 != (unsigned_short *)0x0 || local_70 != 0) || local_60 != 0) {
          if (local_48 != local_40) {
            lVar1 = local_60 + local_70 * 8;
            lVar58 = 2;
            lVar59 = 0;
            do {
              (&local_c8)[lVar59] =
                   (undefined1 (*) [16])
                   (lVar55 + uVar6 +
                   (long)(&((pDVar5->optimizationData).
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->base)[lVar58] * lVar1 * 2);
              lVar59 = lVar59 + 1;
              lVar58 = lVar58 + 7;
            } while (uVar61 + (uVar61 == 0) != lVar59);
          }
          if ((uVar61 == 3) || (uVar61 == 6)) {
            optimizedWriteToRGB((unsigned_short **)&local_c8,&local_c0,(unsigned_short **)&local_b8,
                                &local_80,&local_70,&local_60);
            if (local_58 == 0x150) {
              optimizedWriteToRGB(&local_b0,(unsigned_short **)&local_a8,&local_a0,&local_78,
                                  &local_70,&local_60);
            }
          }
          else {
            if ((uVar61 != 8) && (uVar61 != 4)) {
              this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::LogicExc::LogicExc(this_00,"IIF mode called with incorrect channel pattern");
              __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
            }
            psVar7 = (pDVar5->optimizationData).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (psVar7[3].fill == true) {
              uVar2 = psVar7[3].fillValue._h;
              uVar61 = (ulong)local_c0 | (ulong)local_c8 | (ulong)local_b8;
              uVar56 = (uint)uVar2;
              if ((((ulong)puVar60 & 0xf) == 0) || ((uVar61 & 0xf) == 0)) {
                bVar62 = ((ulong)puVar60 & 0xf) != 0;
                if (((uVar61 & 0xf) == 0) || (bVar62)) {
                  bVar63 = (uVar61 & 0xf) != 0;
                  if ((((ulong)puVar60 & 0xf) == 0) || (bVar63)) {
                    if ((!bVar62 && !bVar63) && (sVar54 != 0)) {
                      auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                      do {
                        auVar97 = *local_c8;
                        uVar8 = local_c0[4];
                        uVar9 = local_c0[5];
                        uVar10 = local_c0[6];
                        uVar11 = local_c0[7];
                        auVar122 = *local_b8;
                        auVar174._0_12_ = auVar97._0_12_;
                        auVar174._12_2_ = auVar97._6_2_;
                        auVar174._14_2_ = local_c0[3];
                        auVar173._12_4_ = auVar174._12_4_;
                        auVar173._0_10_ = auVar97._0_10_;
                        auVar173._10_2_ = local_c0[2];
                        auVar172._10_6_ = auVar173._10_6_;
                        auVar172._0_8_ = auVar97._0_8_;
                        auVar172._8_2_ = auVar97._4_2_;
                        auVar30._4_8_ = auVar172._8_8_;
                        auVar30._2_2_ = local_c0[1];
                        auVar30._0_2_ = auVar97._2_2_;
                        auVar171._0_4_ = CONCAT22(*local_c0,auVar97._0_2_);
                        auVar171._4_12_ = auVar30;
                        uVar81 = auVar72._2_2_;
                        auVar231._0_12_ = auVar122._0_12_;
                        auVar231._12_2_ = auVar122._6_2_;
                        auVar231._14_2_ = uVar81;
                        uVar80 = auVar72._0_2_;
                        auVar230._12_4_ = auVar231._12_4_;
                        auVar230._0_10_ = auVar122._0_10_;
                        auVar230._10_2_ = uVar80;
                        auVar229._10_6_ = auVar230._10_6_;
                        auVar229._0_8_ = auVar122._0_8_;
                        auVar229._8_2_ = auVar122._4_2_;
                        auVar31._4_8_ = auVar229._8_8_;
                        auVar31._2_2_ = uVar81;
                        auVar31._0_2_ = auVar122._2_2_;
                        auVar265._0_8_ = auVar171._0_8_;
                        auVar265._8_4_ = auVar30._0_4_;
                        auVar265._12_4_ = auVar31._0_4_;
                        *(ulong *)puVar60 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar171._0_4_)
                        ;
                        *(long *)(puVar60 + 4) = auVar265._8_8_;
                        *(int *)(puVar60 + 8) = auVar172._8_4_;
                        *(int *)(puVar60 + 10) = auVar229._8_4_;
                        *(undefined4 *)(puVar60 + 0xc) = auVar173._12_4_;
                        *(undefined4 *)(puVar60 + 0xe) = auVar230._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                        auVar85._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                        auVar85._8_2_ = auVar97._12_2_;
                        auVar85._10_2_ = uVar10;
                        auVar96._12_2_ = auVar97._14_2_;
                        auVar96._0_12_ = auVar85;
                        auVar96._14_2_ = uVar11;
                        uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                        auVar134._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                        auVar134._8_2_ = auVar122._12_2_;
                        auVar134._10_2_ = uVar80;
                        auVar142._12_2_ = auVar122._14_2_;
                        auVar142._0_12_ = auVar134;
                        auVar142._14_2_ = uVar81;
                        auVar121._8_4_ = (int)((ulong)auVar85._0_8_ >> 0x20);
                        auVar121._0_8_ = auVar85._0_8_;
                        auVar121._12_4_ = (int)((ulong)auVar134._0_8_ >> 0x20);
                        *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                        *(long *)(puVar60 + 0x14) = auVar121._8_8_;
                        *(int *)(puVar60 + 0x18) = auVar85._8_4_;
                        *(int *)(puVar60 + 0x1a) = auVar134._8_4_;
                        *(int *)(puVar60 + 0x1c) = auVar96._12_4_;
                        *(int *)(puVar60 + 0x1e) = auVar142._12_4_;
                        puVar60 = puVar60 + 0x20;
                        local_b8 = local_b8 + 1;
                        local_c0 = local_c0 + 8;
                        local_c8 = local_c8 + 1;
                        sVar54 = sVar54 - 1;
                      } while (sVar54 != 0);
                    }
                  }
                  else if (sVar54 != 0) {
                    auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                    do {
                      auVar97 = *local_c8;
                      uVar8 = local_c0[4];
                      uVar9 = local_c0[5];
                      uVar10 = local_c0[6];
                      uVar11 = local_c0[7];
                      auVar122 = *local_b8;
                      auVar166._0_12_ = auVar97._0_12_;
                      auVar166._12_2_ = auVar97._6_2_;
                      auVar166._14_2_ = local_c0[3];
                      auVar165._12_4_ = auVar166._12_4_;
                      auVar165._0_10_ = auVar97._0_10_;
                      auVar165._10_2_ = local_c0[2];
                      auVar164._10_6_ = auVar165._10_6_;
                      auVar164._0_8_ = auVar97._0_8_;
                      auVar164._8_2_ = auVar97._4_2_;
                      auVar26._4_8_ = auVar164._8_8_;
                      auVar26._2_2_ = local_c0[1];
                      auVar26._0_2_ = auVar97._2_2_;
                      auVar163._0_4_ = CONCAT22(*local_c0,auVar97._0_2_);
                      auVar163._4_12_ = auVar26;
                      uVar81 = auVar72._2_2_;
                      auVar225._0_12_ = auVar122._0_12_;
                      auVar225._12_2_ = auVar122._6_2_;
                      auVar225._14_2_ = uVar81;
                      uVar80 = auVar72._0_2_;
                      auVar224._12_4_ = auVar225._12_4_;
                      auVar224._0_10_ = auVar122._0_10_;
                      auVar224._10_2_ = uVar80;
                      auVar223._10_6_ = auVar224._10_6_;
                      auVar223._0_8_ = auVar122._0_8_;
                      auVar223._8_2_ = auVar122._4_2_;
                      auVar27._4_8_ = auVar223._8_8_;
                      auVar27._2_2_ = uVar81;
                      auVar27._0_2_ = auVar122._2_2_;
                      auVar263._0_8_ = auVar163._0_8_;
                      auVar263._8_4_ = auVar26._0_4_;
                      auVar263._12_4_ = auVar27._0_4_;
                      *(ulong *)puVar60 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar163._0_4_);
                      *(long *)(puVar60 + 4) = auVar263._8_8_;
                      *(int *)(puVar60 + 8) = auVar164._8_4_;
                      *(int *)(puVar60 + 10) = auVar223._8_4_;
                      *(undefined4 *)(puVar60 + 0xc) = auVar165._12_4_;
                      *(undefined4 *)(puVar60 + 0xe) = auVar224._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                      auVar84._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                      auVar84._8_2_ = auVar97._12_2_;
                      auVar84._10_2_ = uVar10;
                      auVar94._12_2_ = auVar97._14_2_;
                      auVar94._0_12_ = auVar84;
                      auVar94._14_2_ = uVar11;
                      uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                      auVar133._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                      auVar133._8_2_ = auVar122._12_2_;
                      auVar133._10_2_ = uVar80;
                      auVar141._12_2_ = auVar122._14_2_;
                      auVar141._0_12_ = auVar133;
                      auVar141._14_2_ = uVar81;
                      auVar119._8_4_ = (int)((ulong)auVar84._0_8_ >> 0x20);
                      auVar119._0_8_ = auVar84._0_8_;
                      auVar119._12_4_ = (int)((ulong)auVar133._0_8_ >> 0x20);
                      *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                      *(long *)(puVar60 + 0x14) = auVar119._8_8_;
                      *(int *)(puVar60 + 0x18) = auVar84._8_4_;
                      *(int *)(puVar60 + 0x1a) = auVar133._8_4_;
                      *(int *)(puVar60 + 0x1c) = auVar94._12_4_;
                      *(int *)(puVar60 + 0x1e) = auVar141._12_4_;
                      puVar60 = puVar60 + 0x20;
                      local_b8 = local_b8 + 1;
                      local_c0 = local_c0 + 8;
                      local_c8 = local_c8 + 1;
                      sVar54 = sVar54 - 1;
                    } while (sVar54 != 0);
                  }
                }
                else if (sVar54 != 0) {
                  auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                  do {
                    auVar97 = *local_c8;
                    uVar8 = local_c0[4];
                    uVar9 = local_c0[5];
                    uVar10 = local_c0[6];
                    uVar11 = local_c0[7];
                    auVar122 = *local_b8;
                    auVar158._0_12_ = auVar97._0_12_;
                    auVar158._12_2_ = auVar97._6_2_;
                    auVar158._14_2_ = local_c0[3];
                    auVar157._12_4_ = auVar158._12_4_;
                    auVar157._0_10_ = auVar97._0_10_;
                    auVar157._10_2_ = local_c0[2];
                    auVar156._10_6_ = auVar157._10_6_;
                    auVar156._0_8_ = auVar97._0_8_;
                    auVar156._8_2_ = auVar97._4_2_;
                    auVar22._4_8_ = auVar156._8_8_;
                    auVar22._2_2_ = local_c0[1];
                    auVar22._0_2_ = auVar97._2_2_;
                    auVar155._0_4_ = CONCAT22(*local_c0,auVar97._0_2_);
                    auVar155._4_12_ = auVar22;
                    uVar81 = auVar72._2_2_;
                    auVar219._0_12_ = auVar122._0_12_;
                    auVar219._12_2_ = auVar122._6_2_;
                    auVar219._14_2_ = uVar81;
                    uVar80 = auVar72._0_2_;
                    auVar218._12_4_ = auVar219._12_4_;
                    auVar218._0_10_ = auVar122._0_10_;
                    auVar218._10_2_ = uVar80;
                    auVar217._10_6_ = auVar218._10_6_;
                    auVar217._0_8_ = auVar122._0_8_;
                    auVar217._8_2_ = auVar122._4_2_;
                    auVar23._4_8_ = auVar217._8_8_;
                    auVar23._2_2_ = uVar81;
                    auVar23._0_2_ = auVar122._2_2_;
                    auVar261._0_8_ = auVar155._0_8_;
                    auVar261._8_4_ = auVar22._0_4_;
                    auVar261._12_4_ = auVar23._0_4_;
                    *(ulong *)puVar60 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar155._0_4_);
                    *(long *)(puVar60 + 4) = auVar261._8_8_;
                    *(int *)(puVar60 + 8) = auVar156._8_4_;
                    *(int *)(puVar60 + 10) = auVar217._8_4_;
                    *(undefined4 *)(puVar60 + 0xc) = auVar157._12_4_;
                    *(undefined4 *)(puVar60 + 0xe) = auVar218._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                    auVar83._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                    auVar83._8_2_ = auVar97._12_2_;
                    auVar83._10_2_ = uVar10;
                    auVar92._12_2_ = auVar97._14_2_;
                    auVar92._0_12_ = auVar83;
                    auVar92._14_2_ = uVar11;
                    uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                    auVar132._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                    auVar132._8_2_ = auVar122._12_2_;
                    auVar132._10_2_ = uVar80;
                    auVar140._12_2_ = auVar122._14_2_;
                    auVar140._0_12_ = auVar132;
                    auVar140._14_2_ = uVar81;
                    auVar117._8_4_ = (int)((ulong)auVar83._0_8_ >> 0x20);
                    auVar117._0_8_ = auVar83._0_8_;
                    auVar117._12_4_ = (int)((ulong)auVar132._0_8_ >> 0x20);
                    *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                    *(long *)(puVar60 + 0x14) = auVar117._8_8_;
                    *(int *)(puVar60 + 0x18) = auVar83._8_4_;
                    *(int *)(puVar60 + 0x1a) = auVar132._8_4_;
                    *(int *)(puVar60 + 0x1c) = auVar92._12_4_;
                    *(int *)(puVar60 + 0x1e) = auVar140._12_4_;
                    puVar60 = puVar60 + 0x20;
                    local_b8 = local_b8 + 1;
                    local_c0 = local_c0 + 8;
                    local_c8 = local_c8 + 1;
                    sVar54 = sVar54 - 1;
                  } while (sVar54 != 0);
                }
              }
              else if (sVar54 != 0) {
                auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                do {
                  auVar97 = *local_c8;
                  uVar8 = local_c0[4];
                  uVar9 = local_c0[5];
                  uVar10 = local_c0[6];
                  uVar11 = local_c0[7];
                  auVar122 = *local_b8;
                  auVar150._0_12_ = auVar97._0_12_;
                  auVar150._12_2_ = auVar97._6_2_;
                  auVar150._14_2_ = local_c0[3];
                  auVar149._12_4_ = auVar150._12_4_;
                  auVar149._0_10_ = auVar97._0_10_;
                  auVar149._10_2_ = local_c0[2];
                  auVar148._10_6_ = auVar149._10_6_;
                  auVar148._0_8_ = auVar97._0_8_;
                  auVar148._8_2_ = auVar97._4_2_;
                  auVar18._4_8_ = auVar148._8_8_;
                  auVar18._2_2_ = local_c0[1];
                  auVar18._0_2_ = auVar97._2_2_;
                  auVar147._0_4_ = CONCAT22(*local_c0,auVar97._0_2_);
                  auVar147._4_12_ = auVar18;
                  uVar81 = auVar72._2_2_;
                  auVar213._0_12_ = auVar122._0_12_;
                  auVar213._12_2_ = auVar122._6_2_;
                  auVar213._14_2_ = uVar81;
                  uVar80 = auVar72._0_2_;
                  auVar212._12_4_ = auVar213._12_4_;
                  auVar212._0_10_ = auVar122._0_10_;
                  auVar212._10_2_ = uVar80;
                  auVar211._10_6_ = auVar212._10_6_;
                  auVar211._0_8_ = auVar122._0_8_;
                  auVar211._8_2_ = auVar122._4_2_;
                  auVar19._4_8_ = auVar211._8_8_;
                  auVar19._2_2_ = uVar81;
                  auVar19._0_2_ = auVar122._2_2_;
                  auVar259._0_8_ = auVar147._0_8_;
                  auVar259._8_4_ = auVar18._0_4_;
                  auVar259._12_4_ = auVar19._0_4_;
                  *(ulong *)puVar60 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar147._0_4_);
                  *(long *)(puVar60 + 4) = auVar259._8_8_;
                  *(int *)(puVar60 + 8) = auVar148._8_4_;
                  *(int *)(puVar60 + 10) = auVar211._8_4_;
                  *(undefined4 *)(puVar60 + 0xc) = auVar149._12_4_;
                  *(undefined4 *)(puVar60 + 0xe) = auVar212._12_4_;
                  uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                  auVar82._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                  auVar82._8_2_ = auVar97._12_2_;
                  auVar82._10_2_ = uVar10;
                  auVar90._12_2_ = auVar97._14_2_;
                  auVar90._0_12_ = auVar82;
                  auVar90._14_2_ = uVar11;
                  uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                  auVar131._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                  auVar131._8_2_ = auVar122._12_2_;
                  auVar131._10_2_ = uVar80;
                  auVar139._12_2_ = auVar122._14_2_;
                  auVar139._0_12_ = auVar131;
                  auVar139._14_2_ = uVar81;
                  auVar115._8_4_ = (int)((ulong)auVar82._0_8_ >> 0x20);
                  auVar115._0_8_ = auVar82._0_8_;
                  auVar115._12_4_ = (int)((ulong)auVar131._0_8_ >> 0x20);
                  *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                  *(long *)(puVar60 + 0x14) = auVar115._8_8_;
                  *(int *)(puVar60 + 0x18) = auVar82._8_4_;
                  *(int *)(puVar60 + 0x1a) = auVar131._8_4_;
                  *(int *)(puVar60 + 0x1c) = auVar90._12_4_;
                  *(int *)(puVar60 + 0x1e) = auVar139._12_4_;
                  puVar60 = puVar60 + 0x20;
                  local_b8 = local_b8 + 1;
                  local_c0 = local_c0 + 8;
                  local_c8 = local_c8 + 1;
                  sVar54 = sVar54 - 1;
                } while (sVar54 != 0);
              }
              if (sVar53 != 0) {
                lVar55 = 0;
                sVar54 = 0;
                do {
                  puVar60[sVar54 * 4] = *(unsigned_short *)(*local_c8 + sVar54 * 2);
                  puVar60[sVar54 * 4 + 1] = local_c0[sVar54];
                  puVar60[sVar54 * 4 + 2] = *(unsigned_short *)(*local_b8 + sVar54 * 2);
                  puVar60[sVar54 * 4 + 3] = uVar2;
                  sVar54 = sVar54 + 1;
                  lVar55 = lVar55 + -2;
                } while (sVar53 != sVar54);
                local_c8 = (undefined1 (*) [16])((long)local_c8 - lVar55);
                local_c0 = (unsigned_short *)((long)local_c0 - lVar55);
                local_b8 = (undefined1 (*) [16])((long)local_b8 - lVar55);
              }
            }
            else {
              uVar61 = (ulong)local_b8 | (ulong)local_b0 | (ulong)local_c0 | (ulong)local_c8;
              if ((((ulong)puVar60 & 0xf) == 0) || ((uVar61 & 0xf) == 0)) {
                bVar62 = ((ulong)puVar60 & 0xf) != 0;
                if (((uVar61 & 0xf) == 0) || (bVar62)) {
                  bVar63 = (uVar61 & 0xf) != 0;
                  if ((((ulong)puVar60 & 0xf) == 0) || (bVar63)) {
                    if ((!bVar62 && !bVar63) && sVar54 != 0) {
                      do {
                        auVar72 = *local_c8;
                        uVar8 = local_c0[4];
                        uVar9 = local_c0[5];
                        uVar10 = local_c0[6];
                        uVar11 = local_c0[7];
                        auVar97 = *local_b8;
                        uVar12 = local_b0[4];
                        uVar13 = local_b0[5];
                        uVar14 = local_b0[6];
                        uVar15 = local_b0[7];
                        auVar178._0_12_ = auVar72._0_12_;
                        auVar178._12_2_ = auVar72._6_2_;
                        auVar178._14_2_ = local_c0[3];
                        auVar177._12_4_ = auVar178._12_4_;
                        auVar177._0_10_ = auVar72._0_10_;
                        auVar177._10_2_ = local_c0[2];
                        auVar176._10_6_ = auVar177._10_6_;
                        auVar176._0_8_ = auVar72._0_8_;
                        auVar176._8_2_ = auVar72._4_2_;
                        auVar32._4_8_ = auVar176._8_8_;
                        auVar32._2_2_ = local_c0[1];
                        auVar32._0_2_ = auVar72._2_2_;
                        auVar175._0_4_ = CONCAT22(*local_c0,auVar72._0_2_);
                        auVar175._4_12_ = auVar32;
                        auVar234._0_12_ = auVar97._0_12_;
                        auVar234._12_2_ = auVar97._6_2_;
                        auVar234._14_2_ = local_b0[3];
                        auVar233._12_4_ = auVar234._12_4_;
                        auVar233._0_10_ = auVar97._0_10_;
                        auVar233._10_2_ = local_b0[2];
                        auVar232._10_6_ = auVar233._10_6_;
                        auVar232._0_8_ = auVar97._0_8_;
                        auVar232._8_2_ = auVar97._4_2_;
                        auVar33._4_8_ = auVar232._8_8_;
                        auVar33._2_2_ = local_b0[1];
                        auVar33._0_2_ = auVar97._2_2_;
                        auVar266._0_8_ = auVar175._0_8_;
                        auVar266._8_4_ = auVar32._0_4_;
                        auVar266._12_4_ = auVar33._0_4_;
                        *(ulong *)puVar60 =
                             CONCAT44(CONCAT22(*local_b0,auVar97._0_2_),auVar175._0_4_);
                        *(long *)(puVar60 + 4) = auVar266._8_8_;
                        *(int *)(puVar60 + 8) = auVar176._8_4_;
                        *(int *)(puVar60 + 10) = auVar232._8_4_;
                        *(undefined4 *)(puVar60 + 0xc) = auVar177._12_4_;
                        *(undefined4 *)(puVar60 + 0xe) = auVar233._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                        auVar67._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                        auVar67._8_2_ = auVar72._12_2_;
                        auVar67._10_2_ = uVar10;
                        auVar72._12_2_ = auVar72._14_2_;
                        auVar72._0_12_ = auVar67;
                        auVar72._14_2_ = uVar11;
                        uVar106 = CONCAT22(uVar12,auVar97._8_2_);
                        auVar110._0_8_ = CONCAT26(uVar13,CONCAT24(auVar97._10_2_,uVar106));
                        auVar110._8_2_ = auVar97._12_2_;
                        auVar110._10_2_ = uVar14;
                        auVar122._12_2_ = auVar97._14_2_;
                        auVar122._0_12_ = auVar110;
                        auVar122._14_2_ = uVar15;
                        auVar97._8_4_ = (int)((ulong)auVar67._0_8_ >> 0x20);
                        auVar97._0_8_ = auVar67._0_8_;
                        auVar97._12_4_ = (int)((ulong)auVar110._0_8_ >> 0x20);
                        *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                        *(long *)(puVar60 + 0x14) = auVar97._8_8_;
                        *(int *)(puVar60 + 0x18) = auVar67._8_4_;
                        *(int *)(puVar60 + 0x1a) = auVar110._8_4_;
                        *(int *)(puVar60 + 0x1c) = auVar72._12_4_;
                        *(int *)(puVar60 + 0x1e) = auVar122._12_4_;
                        puVar60 = puVar60 + 0x20;
                        local_b0 = local_b0 + 8;
                        local_b8 = local_b8 + 1;
                        local_c0 = local_c0 + 8;
                        local_c8 = local_c8 + 1;
                        sVar54 = sVar54 - 1;
                      } while (sVar54 != 0);
                    }
                  }
                  else {
                    for (; sVar54 != 0; sVar54 = sVar54 - 1) {
                      auVar72 = *local_c8;
                      uVar8 = local_c0[4];
                      uVar9 = local_c0[5];
                      uVar10 = local_c0[6];
                      uVar11 = local_c0[7];
                      auVar97 = *local_b8;
                      uVar12 = local_b0[4];
                      uVar13 = local_b0[5];
                      uVar14 = local_b0[6];
                      uVar15 = local_b0[7];
                      auVar170._0_12_ = auVar72._0_12_;
                      auVar170._12_2_ = auVar72._6_2_;
                      auVar170._14_2_ = local_c0[3];
                      auVar169._12_4_ = auVar170._12_4_;
                      auVar169._0_10_ = auVar72._0_10_;
                      auVar169._10_2_ = local_c0[2];
                      auVar168._10_6_ = auVar169._10_6_;
                      auVar168._0_8_ = auVar72._0_8_;
                      auVar168._8_2_ = auVar72._4_2_;
                      auVar28._4_8_ = auVar168._8_8_;
                      auVar28._2_2_ = local_c0[1];
                      auVar28._0_2_ = auVar72._2_2_;
                      auVar167._0_4_ = CONCAT22(*local_c0,auVar72._0_2_);
                      auVar167._4_12_ = auVar28;
                      auVar228._0_12_ = auVar97._0_12_;
                      auVar228._12_2_ = auVar97._6_2_;
                      auVar228._14_2_ = local_b0[3];
                      auVar227._12_4_ = auVar228._12_4_;
                      auVar227._0_10_ = auVar97._0_10_;
                      auVar227._10_2_ = local_b0[2];
                      auVar226._10_6_ = auVar227._10_6_;
                      auVar226._0_8_ = auVar97._0_8_;
                      auVar226._8_2_ = auVar97._4_2_;
                      auVar29._4_8_ = auVar226._8_8_;
                      auVar29._2_2_ = local_b0[1];
                      auVar29._0_2_ = auVar97._2_2_;
                      auVar264._0_8_ = auVar167._0_8_;
                      auVar264._8_4_ = auVar28._0_4_;
                      auVar264._12_4_ = auVar29._0_4_;
                      *(ulong *)puVar60 = CONCAT44(CONCAT22(*local_b0,auVar97._0_2_),auVar167._0_4_)
                      ;
                      *(long *)(puVar60 + 4) = auVar264._8_8_;
                      *(int *)(puVar60 + 8) = auVar168._8_4_;
                      *(int *)(puVar60 + 10) = auVar226._8_4_;
                      *(undefined4 *)(puVar60 + 0xc) = auVar169._12_4_;
                      *(undefined4 *)(puVar60 + 0xe) = auVar227._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                      auVar66._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                      auVar66._8_2_ = auVar72._12_2_;
                      auVar66._10_2_ = uVar10;
                      auVar75._12_2_ = auVar72._14_2_;
                      auVar75._0_12_ = auVar66;
                      auVar75._14_2_ = uVar11;
                      uVar106 = CONCAT22(uVar12,auVar97._8_2_);
                      auVar109._0_8_ = CONCAT26(uVar13,CONCAT24(auVar97._10_2_,uVar106));
                      auVar109._8_2_ = auVar97._12_2_;
                      auVar109._10_2_ = uVar14;
                      auVar120._12_2_ = auVar97._14_2_;
                      auVar120._0_12_ = auVar109;
                      auVar120._14_2_ = uVar15;
                      auVar95._8_4_ = (int)((ulong)auVar66._0_8_ >> 0x20);
                      auVar95._0_8_ = auVar66._0_8_;
                      auVar95._12_4_ = (int)((ulong)auVar109._0_8_ >> 0x20);
                      *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                      *(long *)(puVar60 + 0x14) = auVar95._8_8_;
                      *(int *)(puVar60 + 0x18) = auVar66._8_4_;
                      *(int *)(puVar60 + 0x1a) = auVar109._8_4_;
                      *(int *)(puVar60 + 0x1c) = auVar75._12_4_;
                      *(int *)(puVar60 + 0x1e) = auVar120._12_4_;
                      puVar60 = puVar60 + 0x20;
                      local_b0 = local_b0 + 8;
                      local_b8 = local_b8 + 1;
                      local_c0 = local_c0 + 8;
                      local_c8 = local_c8 + 1;
                    }
                  }
                }
                else {
                  for (; sVar54 != 0; sVar54 = sVar54 - 1) {
                    auVar72 = *local_c8;
                    uVar8 = local_c0[4];
                    uVar9 = local_c0[5];
                    uVar10 = local_c0[6];
                    uVar11 = local_c0[7];
                    auVar97 = *local_b8;
                    uVar12 = local_b0[4];
                    uVar13 = local_b0[5];
                    uVar14 = local_b0[6];
                    uVar15 = local_b0[7];
                    auVar162._0_12_ = auVar72._0_12_;
                    auVar162._12_2_ = auVar72._6_2_;
                    auVar162._14_2_ = local_c0[3];
                    auVar161._12_4_ = auVar162._12_4_;
                    auVar161._0_10_ = auVar72._0_10_;
                    auVar161._10_2_ = local_c0[2];
                    auVar160._10_6_ = auVar161._10_6_;
                    auVar160._0_8_ = auVar72._0_8_;
                    auVar160._8_2_ = auVar72._4_2_;
                    auVar24._4_8_ = auVar160._8_8_;
                    auVar24._2_2_ = local_c0[1];
                    auVar24._0_2_ = auVar72._2_2_;
                    auVar159._0_4_ = CONCAT22(*local_c0,auVar72._0_2_);
                    auVar159._4_12_ = auVar24;
                    auVar222._0_12_ = auVar97._0_12_;
                    auVar222._12_2_ = auVar97._6_2_;
                    auVar222._14_2_ = local_b0[3];
                    auVar221._12_4_ = auVar222._12_4_;
                    auVar221._0_10_ = auVar97._0_10_;
                    auVar221._10_2_ = local_b0[2];
                    auVar220._10_6_ = auVar221._10_6_;
                    auVar220._0_8_ = auVar97._0_8_;
                    auVar220._8_2_ = auVar97._4_2_;
                    auVar25._4_8_ = auVar220._8_8_;
                    auVar25._2_2_ = local_b0[1];
                    auVar25._0_2_ = auVar97._2_2_;
                    auVar262._0_8_ = auVar159._0_8_;
                    auVar262._8_4_ = auVar24._0_4_;
                    auVar262._12_4_ = auVar25._0_4_;
                    *(ulong *)puVar60 = CONCAT44(CONCAT22(*local_b0,auVar97._0_2_),auVar159._0_4_);
                    *(long *)(puVar60 + 4) = auVar262._8_8_;
                    *(int *)(puVar60 + 8) = auVar160._8_4_;
                    *(int *)(puVar60 + 10) = auVar220._8_4_;
                    *(undefined4 *)(puVar60 + 0xc) = auVar161._12_4_;
                    *(undefined4 *)(puVar60 + 0xe) = auVar221._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                    auVar65._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                    auVar65._8_2_ = auVar72._12_2_;
                    auVar65._10_2_ = uVar10;
                    auVar74._12_2_ = auVar72._14_2_;
                    auVar74._0_12_ = auVar65;
                    auVar74._14_2_ = uVar11;
                    uVar106 = CONCAT22(uVar12,auVar97._8_2_);
                    auVar108._0_8_ = CONCAT26(uVar13,CONCAT24(auVar97._10_2_,uVar106));
                    auVar108._8_2_ = auVar97._12_2_;
                    auVar108._10_2_ = uVar14;
                    auVar118._12_2_ = auVar97._14_2_;
                    auVar118._0_12_ = auVar108;
                    auVar118._14_2_ = uVar15;
                    auVar93._8_4_ = (int)((ulong)auVar65._0_8_ >> 0x20);
                    auVar93._0_8_ = auVar65._0_8_;
                    auVar93._12_4_ = (int)((ulong)auVar108._0_8_ >> 0x20);
                    *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                    *(long *)(puVar60 + 0x14) = auVar93._8_8_;
                    *(int *)(puVar60 + 0x18) = auVar65._8_4_;
                    *(int *)(puVar60 + 0x1a) = auVar108._8_4_;
                    *(int *)(puVar60 + 0x1c) = auVar74._12_4_;
                    *(int *)(puVar60 + 0x1e) = auVar118._12_4_;
                    puVar60 = puVar60 + 0x20;
                    local_b0 = local_b0 + 8;
                    local_b8 = local_b8 + 1;
                    local_c0 = local_c0 + 8;
                    local_c8 = local_c8 + 1;
                  }
                }
              }
              else {
                for (; sVar54 != 0; sVar54 = sVar54 - 1) {
                  auVar72 = *local_c8;
                  uVar8 = local_c0[4];
                  uVar9 = local_c0[5];
                  uVar10 = local_c0[6];
                  uVar11 = local_c0[7];
                  auVar97 = *local_b8;
                  uVar12 = local_b0[4];
                  uVar13 = local_b0[5];
                  uVar14 = local_b0[6];
                  uVar15 = local_b0[7];
                  auVar154._0_12_ = auVar72._0_12_;
                  auVar154._12_2_ = auVar72._6_2_;
                  auVar154._14_2_ = local_c0[3];
                  auVar153._12_4_ = auVar154._12_4_;
                  auVar153._0_10_ = auVar72._0_10_;
                  auVar153._10_2_ = local_c0[2];
                  auVar152._10_6_ = auVar153._10_6_;
                  auVar152._0_8_ = auVar72._0_8_;
                  auVar152._8_2_ = auVar72._4_2_;
                  auVar20._4_8_ = auVar152._8_8_;
                  auVar20._2_2_ = local_c0[1];
                  auVar20._0_2_ = auVar72._2_2_;
                  auVar151._0_4_ = CONCAT22(*local_c0,auVar72._0_2_);
                  auVar151._4_12_ = auVar20;
                  auVar216._0_12_ = auVar97._0_12_;
                  auVar216._12_2_ = auVar97._6_2_;
                  auVar216._14_2_ = local_b0[3];
                  auVar215._12_4_ = auVar216._12_4_;
                  auVar215._0_10_ = auVar97._0_10_;
                  auVar215._10_2_ = local_b0[2];
                  auVar214._10_6_ = auVar215._10_6_;
                  auVar214._0_8_ = auVar97._0_8_;
                  auVar214._8_2_ = auVar97._4_2_;
                  auVar21._4_8_ = auVar214._8_8_;
                  auVar21._2_2_ = local_b0[1];
                  auVar21._0_2_ = auVar97._2_2_;
                  auVar260._0_8_ = auVar151._0_8_;
                  auVar260._8_4_ = auVar20._0_4_;
                  auVar260._12_4_ = auVar21._0_4_;
                  *(ulong *)puVar60 = CONCAT44(CONCAT22(*local_b0,auVar97._0_2_),auVar151._0_4_);
                  *(long *)(puVar60 + 4) = auVar260._8_8_;
                  *(int *)(puVar60 + 8) = auVar152._8_4_;
                  *(int *)(puVar60 + 10) = auVar214._8_4_;
                  *(undefined4 *)(puVar60 + 0xc) = auVar153._12_4_;
                  *(undefined4 *)(puVar60 + 0xe) = auVar215._12_4_;
                  uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                  auVar64._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                  auVar64._8_2_ = auVar72._12_2_;
                  auVar64._10_2_ = uVar10;
                  auVar73._12_2_ = auVar72._14_2_;
                  auVar73._0_12_ = auVar64;
                  auVar73._14_2_ = uVar11;
                  uVar106 = CONCAT22(uVar12,auVar97._8_2_);
                  auVar107._0_8_ = CONCAT26(uVar13,CONCAT24(auVar97._10_2_,uVar106));
                  auVar107._8_2_ = auVar97._12_2_;
                  auVar107._10_2_ = uVar14;
                  auVar116._12_2_ = auVar97._14_2_;
                  auVar116._0_12_ = auVar107;
                  auVar116._14_2_ = uVar15;
                  auVar91._8_4_ = (int)((ulong)auVar64._0_8_ >> 0x20);
                  auVar91._0_8_ = auVar64._0_8_;
                  auVar91._12_4_ = (int)((ulong)auVar107._0_8_ >> 0x20);
                  *(ulong *)(puVar60 + 0x10) = CONCAT44(uVar106,uVar51);
                  *(long *)(puVar60 + 0x14) = auVar91._8_8_;
                  *(int *)(puVar60 + 0x18) = auVar64._8_4_;
                  *(int *)(puVar60 + 0x1a) = auVar107._8_4_;
                  *(int *)(puVar60 + 0x1c) = auVar73._12_4_;
                  *(int *)(puVar60 + 0x1e) = auVar116._12_4_;
                  puVar60 = puVar60 + 0x20;
                  local_b0 = local_b0 + 8;
                  local_b8 = local_b8 + 1;
                  local_c0 = local_c0 + 8;
                  local_c8 = local_c8 + 1;
                }
              }
              if (sVar53 != 0) {
                lVar55 = 0;
                do {
                  puVar60[lVar55 * 2] = *(unsigned_short *)(*local_c8 + lVar55);
                  puVar60[lVar55 * 2 + 1] = *(unsigned_short *)((long)local_c0 + lVar55);
                  puVar60[lVar55 * 2 + 2] = *(unsigned_short *)(*local_b8 + lVar55);
                  puVar60[lVar55 * 2 + 3] = *(unsigned_short *)((long)local_b0 + lVar55);
                  lVar55 = lVar55 + 2;
                  sVar53 = sVar53 - 1;
                } while (sVar53 != 0);
                local_c8 = (undefined1 (*) [16])(*local_c8 + lVar55);
                local_c0 = (unsigned_short *)((long)local_c0 + lVar55);
                local_b8 = (undefined1 (*) [16])(*local_b8 + lVar55);
                local_b0 = (unsigned_short *)((long)local_b0 + lVar55);
              }
            }
            if (local_58 == 0x1c0) {
              psVar7 = (local_68->_ifd->optimizationData).
                       super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (psVar7[7].fill == true) {
                uVar2 = psVar7[7].fillValue._h;
                uVar61 = (ulong)local_a0 | (ulong)local_a8 | (ulong)local_98;
                uVar56 = (uint)uVar2;
                if (((ulong)local_78 & 0xf) == 0 || (uVar61 & 0xf) == 0) {
                  bVar62 = ((ulong)local_78 & 0xf) != 0;
                  if (((uVar61 & 0xf) == 0) || (bVar62)) {
                    bVar63 = (uVar61 & 0xf) != 0;
                    if ((((ulong)local_78 & 0xf) == 0) || (bVar63)) {
                      if ((!bVar63 && !bVar62) && (local_70 != 0)) {
                        auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                        do {
                          auVar97 = *local_a8;
                          uVar8 = local_a0[4];
                          uVar9 = local_a0[5];
                          uVar10 = local_a0[6];
                          uVar11 = local_a0[7];
                          auVar122 = *local_98;
                          auVar206._0_12_ = auVar97._0_12_;
                          auVar206._12_2_ = auVar97._6_2_;
                          auVar206._14_2_ = local_a0[3];
                          auVar205._12_4_ = auVar206._12_4_;
                          auVar205._0_10_ = auVar97._0_10_;
                          auVar205._10_2_ = local_a0[2];
                          auVar204._10_6_ = auVar205._10_6_;
                          auVar204._0_8_ = auVar97._0_8_;
                          auVar204._8_2_ = auVar97._4_2_;
                          auVar46._4_8_ = auVar204._8_8_;
                          auVar46._2_2_ = local_a0[1];
                          auVar46._0_2_ = auVar97._2_2_;
                          auVar203._0_4_ = CONCAT22(*local_a0,auVar97._0_2_);
                          auVar203._4_12_ = auVar46;
                          uVar81 = auVar72._2_2_;
                          auVar255._0_12_ = auVar122._0_12_;
                          auVar255._12_2_ = auVar122._6_2_;
                          auVar255._14_2_ = uVar81;
                          uVar80 = auVar72._0_2_;
                          auVar254._12_4_ = auVar255._12_4_;
                          auVar254._0_10_ = auVar122._0_10_;
                          auVar254._10_2_ = uVar80;
                          auVar253._10_6_ = auVar254._10_6_;
                          auVar253._0_8_ = auVar122._0_8_;
                          auVar253._8_2_ = auVar122._4_2_;
                          auVar47._4_8_ = auVar253._8_8_;
                          auVar47._2_2_ = uVar81;
                          auVar47._0_2_ = auVar122._2_2_;
                          auVar273._0_8_ = auVar203._0_8_;
                          auVar273._8_4_ = auVar46._0_4_;
                          auVar273._12_4_ = auVar47._0_4_;
                          *(ulong *)local_78 =
                               CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar203._0_4_);
                          *(long *)(local_78 + 4) = auVar273._8_8_;
                          *(int *)(local_78 + 8) = auVar204._8_4_;
                          *(int *)(local_78 + 10) = auVar253._8_4_;
                          *(undefined4 *)(local_78 + 0xc) = auVar205._12_4_;
                          *(undefined4 *)(local_78 + 0xe) = auVar254._12_4_;
                          uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                          auVar89._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                          auVar89._8_2_ = auVar97._12_2_;
                          auVar89._10_2_ = uVar10;
                          auVar104._12_2_ = auVar97._14_2_;
                          auVar104._0_12_ = auVar89;
                          auVar104._14_2_ = uVar11;
                          uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                          auVar138._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                          auVar138._8_2_ = auVar122._12_2_;
                          auVar138._10_2_ = uVar80;
                          auVar146._12_2_ = auVar122._14_2_;
                          auVar146._0_12_ = auVar138;
                          auVar146._14_2_ = uVar81;
                          auVar129._8_4_ = (int)((ulong)auVar89._0_8_ >> 0x20);
                          auVar129._0_8_ = auVar89._0_8_;
                          auVar129._12_4_ = (int)((ulong)auVar138._0_8_ >> 0x20);
                          *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                          *(long *)(local_78 + 0x14) = auVar129._8_8_;
                          *(int *)(local_78 + 0x18) = auVar89._8_4_;
                          *(int *)(local_78 + 0x1a) = auVar138._8_4_;
                          *(int *)(local_78 + 0x1c) = auVar104._12_4_;
                          *(int *)(local_78 + 0x1e) = auVar146._12_4_;
                          local_78 = local_78 + 0x20;
                          local_98 = local_98 + 1;
                          local_a0 = local_a0 + 8;
                          local_a8 = local_a8 + 1;
                          local_70 = local_70 - 1;
                        } while (local_70 != 0);
                      }
                    }
                    else if (local_70 != 0) {
                      auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                      do {
                        auVar97 = *local_a8;
                        uVar8 = local_a0[4];
                        uVar9 = local_a0[5];
                        uVar10 = local_a0[6];
                        uVar11 = local_a0[7];
                        auVar122 = *local_98;
                        auVar198._0_12_ = auVar97._0_12_;
                        auVar198._12_2_ = auVar97._6_2_;
                        auVar198._14_2_ = local_a0[3];
                        auVar197._12_4_ = auVar198._12_4_;
                        auVar197._0_10_ = auVar97._0_10_;
                        auVar197._10_2_ = local_a0[2];
                        auVar196._10_6_ = auVar197._10_6_;
                        auVar196._0_8_ = auVar97._0_8_;
                        auVar196._8_2_ = auVar97._4_2_;
                        auVar42._4_8_ = auVar196._8_8_;
                        auVar42._2_2_ = local_a0[1];
                        auVar42._0_2_ = auVar97._2_2_;
                        auVar195._0_4_ = CONCAT22(*local_a0,auVar97._0_2_);
                        auVar195._4_12_ = auVar42;
                        uVar81 = auVar72._2_2_;
                        auVar249._0_12_ = auVar122._0_12_;
                        auVar249._12_2_ = auVar122._6_2_;
                        auVar249._14_2_ = uVar81;
                        uVar80 = auVar72._0_2_;
                        auVar248._12_4_ = auVar249._12_4_;
                        auVar248._0_10_ = auVar122._0_10_;
                        auVar248._10_2_ = uVar80;
                        auVar247._10_6_ = auVar248._10_6_;
                        auVar247._0_8_ = auVar122._0_8_;
                        auVar247._8_2_ = auVar122._4_2_;
                        auVar43._4_8_ = auVar247._8_8_;
                        auVar43._2_2_ = uVar81;
                        auVar43._0_2_ = auVar122._2_2_;
                        auVar271._0_8_ = auVar195._0_8_;
                        auVar271._8_4_ = auVar42._0_4_;
                        auVar271._12_4_ = auVar43._0_4_;
                        *(ulong *)local_78 =
                             CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar195._0_4_);
                        *(long *)(local_78 + 4) = auVar271._8_8_;
                        *(int *)(local_78 + 8) = auVar196._8_4_;
                        *(int *)(local_78 + 10) = auVar247._8_4_;
                        *(undefined4 *)(local_78 + 0xc) = auVar197._12_4_;
                        *(undefined4 *)(local_78 + 0xe) = auVar248._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                        auVar88._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                        auVar88._8_2_ = auVar97._12_2_;
                        auVar88._10_2_ = uVar10;
                        auVar102._12_2_ = auVar97._14_2_;
                        auVar102._0_12_ = auVar88;
                        auVar102._14_2_ = uVar11;
                        uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                        auVar137._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                        auVar137._8_2_ = auVar122._12_2_;
                        auVar137._10_2_ = uVar80;
                        auVar145._12_2_ = auVar122._14_2_;
                        auVar145._0_12_ = auVar137;
                        auVar145._14_2_ = uVar81;
                        auVar127._8_4_ = (int)((ulong)auVar88._0_8_ >> 0x20);
                        auVar127._0_8_ = auVar88._0_8_;
                        auVar127._12_4_ = (int)((ulong)auVar137._0_8_ >> 0x20);
                        *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                        *(long *)(local_78 + 0x14) = auVar127._8_8_;
                        *(int *)(local_78 + 0x18) = auVar88._8_4_;
                        *(int *)(local_78 + 0x1a) = auVar137._8_4_;
                        *(int *)(local_78 + 0x1c) = auVar102._12_4_;
                        *(int *)(local_78 + 0x1e) = auVar145._12_4_;
                        local_78 = local_78 + 0x20;
                        local_98 = local_98 + 1;
                        local_a0 = local_a0 + 8;
                        local_a8 = local_a8 + 1;
                        local_70 = local_70 - 1;
                      } while (local_70 != 0);
                    }
                  }
                  else if (local_70 != 0) {
                    auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                    do {
                      auVar97 = *local_a8;
                      uVar8 = local_a0[4];
                      uVar9 = local_a0[5];
                      uVar10 = local_a0[6];
                      uVar11 = local_a0[7];
                      auVar122 = *local_98;
                      auVar182._0_12_ = auVar97._0_12_;
                      auVar182._12_2_ = auVar97._6_2_;
                      auVar182._14_2_ = local_a0[3];
                      auVar181._12_4_ = auVar182._12_4_;
                      auVar181._0_10_ = auVar97._0_10_;
                      auVar181._10_2_ = local_a0[2];
                      auVar180._10_6_ = auVar181._10_6_;
                      auVar180._0_8_ = auVar97._0_8_;
                      auVar180._8_2_ = auVar97._4_2_;
                      auVar34._4_8_ = auVar180._8_8_;
                      auVar34._2_2_ = local_a0[1];
                      auVar34._0_2_ = auVar97._2_2_;
                      auVar179._0_4_ = CONCAT22(*local_a0,auVar97._0_2_);
                      auVar179._4_12_ = auVar34;
                      uVar81 = auVar72._2_2_;
                      auVar237._0_12_ = auVar122._0_12_;
                      auVar237._12_2_ = auVar122._6_2_;
                      auVar237._14_2_ = uVar81;
                      uVar80 = auVar72._0_2_;
                      auVar236._12_4_ = auVar237._12_4_;
                      auVar236._0_10_ = auVar122._0_10_;
                      auVar236._10_2_ = uVar80;
                      auVar235._10_6_ = auVar236._10_6_;
                      auVar235._0_8_ = auVar122._0_8_;
                      auVar235._8_2_ = auVar122._4_2_;
                      auVar35._4_8_ = auVar235._8_8_;
                      auVar35._2_2_ = uVar81;
                      auVar35._0_2_ = auVar122._2_2_;
                      auVar267._0_8_ = auVar179._0_8_;
                      auVar267._8_4_ = auVar34._0_4_;
                      auVar267._12_4_ = auVar35._0_4_;
                      *(ulong *)local_78 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar179._0_4_);
                      *(long *)(local_78 + 4) = auVar267._8_8_;
                      *(int *)(local_78 + 8) = auVar180._8_4_;
                      *(int *)(local_78 + 10) = auVar235._8_4_;
                      *(undefined4 *)(local_78 + 0xc) = auVar181._12_4_;
                      *(undefined4 *)(local_78 + 0xe) = auVar236._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                      auVar86._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                      auVar86._8_2_ = auVar97._12_2_;
                      auVar86._10_2_ = uVar10;
                      auVar98._12_2_ = auVar97._14_2_;
                      auVar98._0_12_ = auVar86;
                      auVar98._14_2_ = uVar11;
                      uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                      auVar135._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                      auVar135._8_2_ = auVar122._12_2_;
                      auVar135._10_2_ = uVar80;
                      auVar143._12_2_ = auVar122._14_2_;
                      auVar143._0_12_ = auVar135;
                      auVar143._14_2_ = uVar81;
                      auVar123._8_4_ = (int)((ulong)auVar86._0_8_ >> 0x20);
                      auVar123._0_8_ = auVar86._0_8_;
                      auVar123._12_4_ = (int)((ulong)auVar135._0_8_ >> 0x20);
                      *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                      *(long *)(local_78 + 0x14) = auVar123._8_8_;
                      *(int *)(local_78 + 0x18) = auVar86._8_4_;
                      *(int *)(local_78 + 0x1a) = auVar135._8_4_;
                      *(int *)(local_78 + 0x1c) = auVar98._12_4_;
                      *(int *)(local_78 + 0x1e) = auVar143._12_4_;
                      local_78 = local_78 + 0x20;
                      local_98 = local_98 + 1;
                      local_a0 = local_a0 + 8;
                      local_a8 = local_a8 + 1;
                      local_70 = local_70 - 1;
                    } while (local_70 != 0);
                  }
                }
                else if (local_70 != 0) {
                  auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                  do {
                    auVar97 = *local_a8;
                    uVar8 = local_a0[4];
                    uVar9 = local_a0[5];
                    uVar10 = local_a0[6];
                    uVar11 = local_a0[7];
                    auVar122 = *local_98;
                    auVar190._0_12_ = auVar97._0_12_;
                    auVar190._12_2_ = auVar97._6_2_;
                    auVar190._14_2_ = local_a0[3];
                    auVar189._12_4_ = auVar190._12_4_;
                    auVar189._0_10_ = auVar97._0_10_;
                    auVar189._10_2_ = local_a0[2];
                    auVar188._10_6_ = auVar189._10_6_;
                    auVar188._0_8_ = auVar97._0_8_;
                    auVar188._8_2_ = auVar97._4_2_;
                    auVar38._4_8_ = auVar188._8_8_;
                    auVar38._2_2_ = local_a0[1];
                    auVar38._0_2_ = auVar97._2_2_;
                    auVar187._0_4_ = CONCAT22(*local_a0,auVar97._0_2_);
                    auVar187._4_12_ = auVar38;
                    uVar81 = auVar72._2_2_;
                    auVar243._0_12_ = auVar122._0_12_;
                    auVar243._12_2_ = auVar122._6_2_;
                    auVar243._14_2_ = uVar81;
                    uVar80 = auVar72._0_2_;
                    auVar242._12_4_ = auVar243._12_4_;
                    auVar242._0_10_ = auVar122._0_10_;
                    auVar242._10_2_ = uVar80;
                    auVar241._10_6_ = auVar242._10_6_;
                    auVar241._0_8_ = auVar122._0_8_;
                    auVar241._8_2_ = auVar122._4_2_;
                    auVar39._4_8_ = auVar241._8_8_;
                    auVar39._2_2_ = uVar81;
                    auVar39._0_2_ = auVar122._2_2_;
                    auVar269._0_8_ = auVar187._0_8_;
                    auVar269._8_4_ = auVar38._0_4_;
                    auVar269._12_4_ = auVar39._0_4_;
                    *(ulong *)local_78 = CONCAT44(CONCAT22(uVar80,auVar122._0_2_),auVar187._0_4_);
                    *(long *)(local_78 + 4) = auVar269._8_8_;
                    *(int *)(local_78 + 8) = auVar188._8_4_;
                    *(int *)(local_78 + 10) = auVar241._8_4_;
                    *(undefined4 *)(local_78 + 0xc) = auVar189._12_4_;
                    *(undefined4 *)(local_78 + 0xe) = auVar242._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar97._8_2_);
                    auVar87._0_8_ = CONCAT26(uVar9,CONCAT24(auVar97._10_2_,uVar51));
                    auVar87._8_2_ = auVar97._12_2_;
                    auVar87._10_2_ = uVar10;
                    auVar100._12_2_ = auVar97._14_2_;
                    auVar100._0_12_ = auVar87;
                    auVar100._14_2_ = uVar11;
                    uVar106 = CONCAT22(uVar80,auVar122._8_2_);
                    auVar136._0_8_ = CONCAT26(uVar81,CONCAT24(auVar122._10_2_,uVar106));
                    auVar136._8_2_ = auVar122._12_2_;
                    auVar136._10_2_ = uVar80;
                    auVar144._12_2_ = auVar122._14_2_;
                    auVar144._0_12_ = auVar136;
                    auVar144._14_2_ = uVar81;
                    auVar125._8_4_ = (int)((ulong)auVar87._0_8_ >> 0x20);
                    auVar125._0_8_ = auVar87._0_8_;
                    auVar125._12_4_ = (int)((ulong)auVar136._0_8_ >> 0x20);
                    *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                    *(long *)(local_78 + 0x14) = auVar125._8_8_;
                    *(int *)(local_78 + 0x18) = auVar87._8_4_;
                    *(int *)(local_78 + 0x1a) = auVar136._8_4_;
                    *(int *)(local_78 + 0x1c) = auVar100._12_4_;
                    *(int *)(local_78 + 0x1e) = auVar144._12_4_;
                    local_78 = local_78 + 0x20;
                    local_98 = local_98 + 1;
                    local_a0 = local_a0 + 8;
                    local_a8 = local_a8 + 1;
                    local_70 = local_70 - 1;
                  } while (local_70 != 0);
                }
                if (local_60 != 0) {
                  lVar55 = 0;
                  sVar54 = 0;
                  do {
                    local_78[sVar54 * 4] = *(unsigned_short *)(*local_a8 + sVar54 * 2);
                    local_78[sVar54 * 4 + 1] = local_a0[sVar54];
                    local_78[sVar54 * 4 + 2] = *(unsigned_short *)(*local_98 + sVar54 * 2);
                    local_78[sVar54 * 4 + 3] = uVar2;
                    sVar54 = sVar54 + 1;
                    lVar55 = lVar55 + -2;
                  } while (local_60 != sVar54);
                  local_a8 = (undefined1 (*) [16])((long)local_a8 - lVar55);
                  local_a0 = (unsigned_short *)((long)local_a0 - lVar55);
                }
              }
              else {
                uVar61 = (ulong)local_98 | (ulong)local_90 | (ulong)local_a0 | (ulong)local_a8;
                if (((ulong)local_78 & 0xf) == 0 || (uVar61 & 0xf) == 0) {
                  bVar62 = ((ulong)local_78 & 0xf) != 0;
                  if (((uVar61 & 0xf) == 0) || (bVar62)) {
                    bVar63 = (uVar61 & 0xf) != 0;
                    if ((((ulong)local_78 & 0xf) == 0) || (bVar63)) {
                      if (local_70 != 0 && (!bVar63 && !bVar62)) {
                        do {
                          auVar72 = *local_a8;
                          uVar8 = local_a0[4];
                          uVar9 = local_a0[5];
                          uVar10 = local_a0[6];
                          uVar11 = local_a0[7];
                          auVar97 = *local_98;
                          uVar80 = local_90[4];
                          uVar81 = local_90[5];
                          uVar16 = local_90[6];
                          uVar17 = local_90[7];
                          auVar210._0_12_ = auVar72._0_12_;
                          auVar210._12_2_ = auVar72._6_2_;
                          auVar210._14_2_ = local_a0[3];
                          auVar209._12_4_ = auVar210._12_4_;
                          auVar209._0_10_ = auVar72._0_10_;
                          auVar209._10_2_ = local_a0[2];
                          auVar208._10_6_ = auVar209._10_6_;
                          auVar208._0_8_ = auVar72._0_8_;
                          auVar208._8_2_ = auVar72._4_2_;
                          auVar48._4_8_ = auVar208._8_8_;
                          auVar48._2_2_ = local_a0[1];
                          auVar48._0_2_ = auVar72._2_2_;
                          auVar207._0_4_ = CONCAT22(*local_a0,auVar72._0_2_);
                          auVar207._4_12_ = auVar48;
                          auVar258._0_12_ = auVar97._0_12_;
                          auVar258._12_2_ = auVar97._6_2_;
                          auVar258._14_2_ = local_90[3];
                          auVar257._12_4_ = auVar258._12_4_;
                          auVar257._0_10_ = auVar97._0_10_;
                          auVar257._10_2_ = local_90[2];
                          auVar256._10_6_ = auVar257._10_6_;
                          auVar256._0_8_ = auVar97._0_8_;
                          auVar256._8_2_ = auVar97._4_2_;
                          auVar49._4_8_ = auVar256._8_8_;
                          auVar49._2_2_ = local_90[1];
                          auVar49._0_2_ = auVar97._2_2_;
                          auVar274._0_8_ = auVar207._0_8_;
                          auVar274._8_4_ = auVar48._0_4_;
                          auVar274._12_4_ = auVar49._0_4_;
                          *(ulong *)local_78 =
                               CONCAT44(CONCAT22(*local_90,auVar97._0_2_),auVar207._0_4_);
                          *(long *)(local_78 + 4) = auVar274._8_8_;
                          *(int *)(local_78 + 8) = auVar208._8_4_;
                          *(int *)(local_78 + 10) = auVar256._8_4_;
                          *(undefined4 *)(local_78 + 0xc) = auVar209._12_4_;
                          *(undefined4 *)(local_78 + 0xe) = auVar257._12_4_;
                          uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                          auVar71._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                          auVar71._8_2_ = auVar72._12_2_;
                          auVar71._10_2_ = uVar10;
                          auVar79._12_2_ = auVar72._14_2_;
                          auVar79._0_12_ = auVar71;
                          auVar79._14_2_ = uVar11;
                          uVar106 = CONCAT22(uVar80,auVar97._8_2_);
                          auVar114._0_8_ = CONCAT26(uVar81,CONCAT24(auVar97._10_2_,uVar106));
                          auVar114._8_2_ = auVar97._12_2_;
                          auVar114._10_2_ = uVar16;
                          auVar130._12_2_ = auVar97._14_2_;
                          auVar130._0_12_ = auVar114;
                          auVar130._14_2_ = uVar17;
                          auVar105._8_4_ = (int)((ulong)auVar71._0_8_ >> 0x20);
                          auVar105._0_8_ = auVar71._0_8_;
                          auVar105._12_4_ = (int)((ulong)auVar114._0_8_ >> 0x20);
                          *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                          *(long *)(local_78 + 0x14) = auVar105._8_8_;
                          *(int *)(local_78 + 0x18) = auVar71._8_4_;
                          *(int *)(local_78 + 0x1a) = auVar114._8_4_;
                          *(int *)(local_78 + 0x1c) = auVar79._12_4_;
                          *(int *)(local_78 + 0x1e) = auVar130._12_4_;
                          local_78 = local_78 + 0x20;
                          local_90 = local_90 + 8;
                          local_98 = local_98 + 1;
                          local_a0 = local_a0 + 8;
                          local_a8 = local_a8 + 1;
                          local_70 = local_70 - 1;
                        } while (local_70 != 0);
                      }
                    }
                    else {
                      for (; local_70 != 0; local_70 = local_70 - 1) {
                        auVar72 = *local_a8;
                        uVar8 = local_a0[4];
                        uVar9 = local_a0[5];
                        uVar10 = local_a0[6];
                        uVar11 = local_a0[7];
                        auVar97 = *local_98;
                        uVar80 = local_90[4];
                        uVar81 = local_90[5];
                        uVar16 = local_90[6];
                        uVar17 = local_90[7];
                        auVar202._0_12_ = auVar72._0_12_;
                        auVar202._12_2_ = auVar72._6_2_;
                        auVar202._14_2_ = local_a0[3];
                        auVar201._12_4_ = auVar202._12_4_;
                        auVar201._0_10_ = auVar72._0_10_;
                        auVar201._10_2_ = local_a0[2];
                        auVar200._10_6_ = auVar201._10_6_;
                        auVar200._0_8_ = auVar72._0_8_;
                        auVar200._8_2_ = auVar72._4_2_;
                        auVar44._4_8_ = auVar200._8_8_;
                        auVar44._2_2_ = local_a0[1];
                        auVar44._0_2_ = auVar72._2_2_;
                        auVar199._0_4_ = CONCAT22(*local_a0,auVar72._0_2_);
                        auVar199._4_12_ = auVar44;
                        auVar252._0_12_ = auVar97._0_12_;
                        auVar252._12_2_ = auVar97._6_2_;
                        auVar252._14_2_ = local_90[3];
                        auVar251._12_4_ = auVar252._12_4_;
                        auVar251._0_10_ = auVar97._0_10_;
                        auVar251._10_2_ = local_90[2];
                        auVar250._10_6_ = auVar251._10_6_;
                        auVar250._0_8_ = auVar97._0_8_;
                        auVar250._8_2_ = auVar97._4_2_;
                        auVar45._4_8_ = auVar250._8_8_;
                        auVar45._2_2_ = local_90[1];
                        auVar45._0_2_ = auVar97._2_2_;
                        auVar272._0_8_ = auVar199._0_8_;
                        auVar272._8_4_ = auVar44._0_4_;
                        auVar272._12_4_ = auVar45._0_4_;
                        *(ulong *)local_78 =
                             CONCAT44(CONCAT22(*local_90,auVar97._0_2_),auVar199._0_4_);
                        *(long *)(local_78 + 4) = auVar272._8_8_;
                        *(int *)(local_78 + 8) = auVar200._8_4_;
                        *(int *)(local_78 + 10) = auVar250._8_4_;
                        *(undefined4 *)(local_78 + 0xc) = auVar201._12_4_;
                        *(undefined4 *)(local_78 + 0xe) = auVar251._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                        auVar70._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                        auVar70._8_2_ = auVar72._12_2_;
                        auVar70._10_2_ = uVar10;
                        auVar78._12_2_ = auVar72._14_2_;
                        auVar78._0_12_ = auVar70;
                        auVar78._14_2_ = uVar11;
                        uVar106 = CONCAT22(uVar80,auVar97._8_2_);
                        auVar113._0_8_ = CONCAT26(uVar81,CONCAT24(auVar97._10_2_,uVar106));
                        auVar113._8_2_ = auVar97._12_2_;
                        auVar113._10_2_ = uVar16;
                        auVar128._12_2_ = auVar97._14_2_;
                        auVar128._0_12_ = auVar113;
                        auVar128._14_2_ = uVar17;
                        auVar103._8_4_ = (int)((ulong)auVar70._0_8_ >> 0x20);
                        auVar103._0_8_ = auVar70._0_8_;
                        auVar103._12_4_ = (int)((ulong)auVar113._0_8_ >> 0x20);
                        *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                        *(long *)(local_78 + 0x14) = auVar103._8_8_;
                        *(int *)(local_78 + 0x18) = auVar70._8_4_;
                        *(int *)(local_78 + 0x1a) = auVar113._8_4_;
                        *(int *)(local_78 + 0x1c) = auVar78._12_4_;
                        *(int *)(local_78 + 0x1e) = auVar128._12_4_;
                        local_78 = local_78 + 0x20;
                        local_90 = local_90 + 8;
                        local_98 = local_98 + 1;
                        local_a0 = local_a0 + 8;
                        local_a8 = local_a8 + 1;
                      }
                    }
                  }
                  else {
                    for (; local_70 != 0; local_70 = local_70 - 1) {
                      auVar72 = *local_a8;
                      uVar8 = local_a0[4];
                      uVar9 = local_a0[5];
                      uVar10 = local_a0[6];
                      uVar11 = local_a0[7];
                      auVar97 = *local_98;
                      uVar80 = local_90[4];
                      uVar81 = local_90[5];
                      uVar16 = local_90[6];
                      uVar17 = local_90[7];
                      auVar186._0_12_ = auVar72._0_12_;
                      auVar186._12_2_ = auVar72._6_2_;
                      auVar186._14_2_ = local_a0[3];
                      auVar185._12_4_ = auVar186._12_4_;
                      auVar185._0_10_ = auVar72._0_10_;
                      auVar185._10_2_ = local_a0[2];
                      auVar184._10_6_ = auVar185._10_6_;
                      auVar184._0_8_ = auVar72._0_8_;
                      auVar184._8_2_ = auVar72._4_2_;
                      auVar36._4_8_ = auVar184._8_8_;
                      auVar36._2_2_ = local_a0[1];
                      auVar36._0_2_ = auVar72._2_2_;
                      auVar183._0_4_ = CONCAT22(*local_a0,auVar72._0_2_);
                      auVar183._4_12_ = auVar36;
                      auVar240._0_12_ = auVar97._0_12_;
                      auVar240._12_2_ = auVar97._6_2_;
                      auVar240._14_2_ = local_90[3];
                      auVar239._12_4_ = auVar240._12_4_;
                      auVar239._0_10_ = auVar97._0_10_;
                      auVar239._10_2_ = local_90[2];
                      auVar238._10_6_ = auVar239._10_6_;
                      auVar238._0_8_ = auVar97._0_8_;
                      auVar238._8_2_ = auVar97._4_2_;
                      auVar37._4_8_ = auVar238._8_8_;
                      auVar37._2_2_ = local_90[1];
                      auVar37._0_2_ = auVar97._2_2_;
                      auVar268._0_8_ = auVar183._0_8_;
                      auVar268._8_4_ = auVar36._0_4_;
                      auVar268._12_4_ = auVar37._0_4_;
                      *(ulong *)local_78 =
                           CONCAT44(CONCAT22(*local_90,auVar97._0_2_),auVar183._0_4_);
                      *(long *)(local_78 + 4) = auVar268._8_8_;
                      *(int *)(local_78 + 8) = auVar184._8_4_;
                      *(int *)(local_78 + 10) = auVar238._8_4_;
                      *(undefined4 *)(local_78 + 0xc) = auVar185._12_4_;
                      *(undefined4 *)(local_78 + 0xe) = auVar239._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                      auVar68._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                      auVar68._8_2_ = auVar72._12_2_;
                      auVar68._10_2_ = uVar10;
                      auVar76._12_2_ = auVar72._14_2_;
                      auVar76._0_12_ = auVar68;
                      auVar76._14_2_ = uVar11;
                      uVar106 = CONCAT22(uVar80,auVar97._8_2_);
                      auVar111._0_8_ = CONCAT26(uVar81,CONCAT24(auVar97._10_2_,uVar106));
                      auVar111._8_2_ = auVar97._12_2_;
                      auVar111._10_2_ = uVar16;
                      auVar124._12_2_ = auVar97._14_2_;
                      auVar124._0_12_ = auVar111;
                      auVar124._14_2_ = uVar17;
                      auVar99._8_4_ = (int)((ulong)auVar68._0_8_ >> 0x20);
                      auVar99._0_8_ = auVar68._0_8_;
                      auVar99._12_4_ = (int)((ulong)auVar111._0_8_ >> 0x20);
                      *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                      *(long *)(local_78 + 0x14) = auVar99._8_8_;
                      *(int *)(local_78 + 0x18) = auVar68._8_4_;
                      *(int *)(local_78 + 0x1a) = auVar111._8_4_;
                      *(int *)(local_78 + 0x1c) = auVar76._12_4_;
                      *(int *)(local_78 + 0x1e) = auVar124._12_4_;
                      local_78 = local_78 + 0x20;
                      local_90 = local_90 + 8;
                      local_98 = local_98 + 1;
                      local_a0 = local_a0 + 8;
                      local_a8 = local_a8 + 1;
                    }
                  }
                }
                else {
                  for (; local_70 != 0; local_70 = local_70 - 1) {
                    auVar72 = *local_a8;
                    uVar8 = local_a0[4];
                    uVar9 = local_a0[5];
                    uVar10 = local_a0[6];
                    uVar11 = local_a0[7];
                    auVar97 = *local_98;
                    uVar80 = local_90[4];
                    uVar81 = local_90[5];
                    uVar16 = local_90[6];
                    uVar17 = local_90[7];
                    auVar194._0_12_ = auVar72._0_12_;
                    auVar194._12_2_ = auVar72._6_2_;
                    auVar194._14_2_ = local_a0[3];
                    auVar193._12_4_ = auVar194._12_4_;
                    auVar193._0_10_ = auVar72._0_10_;
                    auVar193._10_2_ = local_a0[2];
                    auVar192._10_6_ = auVar193._10_6_;
                    auVar192._0_8_ = auVar72._0_8_;
                    auVar192._8_2_ = auVar72._4_2_;
                    auVar40._4_8_ = auVar192._8_8_;
                    auVar40._2_2_ = local_a0[1];
                    auVar40._0_2_ = auVar72._2_2_;
                    auVar191._0_4_ = CONCAT22(*local_a0,auVar72._0_2_);
                    auVar191._4_12_ = auVar40;
                    auVar246._0_12_ = auVar97._0_12_;
                    auVar246._12_2_ = auVar97._6_2_;
                    auVar246._14_2_ = local_90[3];
                    auVar245._12_4_ = auVar246._12_4_;
                    auVar245._0_10_ = auVar97._0_10_;
                    auVar245._10_2_ = local_90[2];
                    auVar244._10_6_ = auVar245._10_6_;
                    auVar244._0_8_ = auVar97._0_8_;
                    auVar244._8_2_ = auVar97._4_2_;
                    auVar41._4_8_ = auVar244._8_8_;
                    auVar41._2_2_ = local_90[1];
                    auVar41._0_2_ = auVar97._2_2_;
                    auVar270._0_8_ = auVar191._0_8_;
                    auVar270._8_4_ = auVar40._0_4_;
                    auVar270._12_4_ = auVar41._0_4_;
                    *(ulong *)local_78 = CONCAT44(CONCAT22(*local_90,auVar97._0_2_),auVar191._0_4_);
                    *(long *)(local_78 + 4) = auVar270._8_8_;
                    *(int *)(local_78 + 8) = auVar192._8_4_;
                    *(int *)(local_78 + 10) = auVar244._8_4_;
                    *(undefined4 *)(local_78 + 0xc) = auVar193._12_4_;
                    *(undefined4 *)(local_78 + 0xe) = auVar245._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                    auVar69._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                    auVar69._8_2_ = auVar72._12_2_;
                    auVar69._10_2_ = uVar10;
                    auVar77._12_2_ = auVar72._14_2_;
                    auVar77._0_12_ = auVar69;
                    auVar77._14_2_ = uVar11;
                    uVar106 = CONCAT22(uVar80,auVar97._8_2_);
                    auVar112._0_8_ = CONCAT26(uVar81,CONCAT24(auVar97._10_2_,uVar106));
                    auVar112._8_2_ = auVar97._12_2_;
                    auVar112._10_2_ = uVar16;
                    auVar126._12_2_ = auVar97._14_2_;
                    auVar126._0_12_ = auVar112;
                    auVar126._14_2_ = uVar17;
                    auVar101._8_4_ = (int)((ulong)auVar69._0_8_ >> 0x20);
                    auVar101._0_8_ = auVar69._0_8_;
                    auVar101._12_4_ = (int)((ulong)auVar112._0_8_ >> 0x20);
                    *(ulong *)(local_78 + 0x10) = CONCAT44(uVar106,uVar51);
                    *(long *)(local_78 + 0x14) = auVar101._8_8_;
                    *(int *)(local_78 + 0x18) = auVar69._8_4_;
                    *(int *)(local_78 + 0x1a) = auVar112._8_4_;
                    *(int *)(local_78 + 0x1c) = auVar77._12_4_;
                    *(int *)(local_78 + 0x1e) = auVar126._12_4_;
                    local_78 = local_78 + 0x20;
                    local_90 = local_90 + 8;
                    local_98 = local_98 + 1;
                    local_a0 = local_a0 + 8;
                    local_a8 = local_a8 + 1;
                  }
                }
                if (local_60 != 0) {
                  lVar55 = 0;
                  sVar54 = 0;
                  do {
                    local_78[sVar54 * 4] = *(unsigned_short *)(*local_a8 + sVar54 * 2);
                    local_78[sVar54 * 4 + 1] = local_a0[sVar54];
                    local_78[sVar54 * 4 + 2] = *(unsigned_short *)(*local_98 + sVar54 * 2);
                    local_78[sVar54 * 4 + 3] = local_90[sVar54];
                    sVar54 = sVar54 + 1;
                    lVar55 = lVar55 + -2;
                  } while (local_60 != sVar54);
                  local_a8 = (undefined1 (*) [16])((long)local_a8 - lVar55);
                  local_a0 = (unsigned_short *)((long)local_a0 - lVar55);
                  local_98 = (undefined1 (*) [16])((long)local_98 - lVar55);
                }
              }
            }
          }
        }
        y = (uint)local_38;
        this = local_68;
        iVar50 = local_50;
        uVar56 = local_4c;
      }
      y = y + iVar50;
    } while (y != uVar56);
  }
  return;
}

Assistant:

void
LineBufferTaskIIF::execute()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
        
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
            
            for (int i = _lineBuffer->minY - _ifd->minY;
            i <= maxY - _ifd->minY;
            ++i)
            {
                uncompressedSize += _ifd->bytesPerLine[i];
            }
            
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();
                
                _lineBuffer->dataSize =
                _lineBuffer->compressor->uncompress (_lineBuffer->buffer,
                                                     _lineBuffer->dataSize,
                                                     _lineBuffer->minY,
                                                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
                
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;
        
        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
        
        for (int y = yStart; y != yStop; y += dy)
        {
            if (modp (y, _optimizationMode._ySampling) != 0)
                continue;
            
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
            
            // Set the readPtr to read at the start of uncompressedData
            // but with an offet based on calculated array.
            // _ifd->offsetInLineBuffer contains offsets based on which
            // line we are currently processing.
            // Stride will be taken into consideration later.
                
                
            const char* readPtr = _lineBuffer->uncompressedData +
            _ifd->offsetInLineBuffer[y - _ifd->minY];
            
            size_t pixelsToCopySSE = 0;
            size_t pixelsToCopyNormal = 0;
            
            unsigned short* writePtrLeft = 0;
            unsigned short* writePtrRight = 0;
            
            size_t channels = _ifd->optimizationData.size();
       
            if(channels>4)
            {
                getWritePointerStereo<half>(y, writePtrRight, writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
            }
            else 
            {
                getWritePointer<half>(y, writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
            }
            
            if (writePtrRight == 0 && pixelsToCopySSE == 0 && pixelsToCopyNormal == 0)
            {
                continue;
            }
            
            
            //
            // support reading up to eight channels
            //
            unsigned short* readPointers[8];
            
            for (size_t i = 0; i < channels ; ++i)
            {
                readPointers[i] = (unsigned short*)readPtr + (_ifd->optimizationData[i].offset * (pixelsToCopySSE * 8 + pixelsToCopyNormal));
            }
            
            //RGB only
            if(channels==3 || channels == 6 )
            {
                    optimizedWriteToRGB(readPointers[0], readPointers[1], readPointers[2], writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                  
                    //stereo RGB
                    if( channels == 6)
                    {
                        optimizedWriteToRGB(readPointers[3], readPointers[4], readPointers[5], writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }                
            //RGBA
            }else if(channels==4 || channels==8)
            {
                
                if(_ifd->optimizationData[3].fill)
                {
                    optimizedWriteToRGBAFillA(readPointers[0], readPointers[1], readPointers[2], _ifd->optimizationData[3].fillValue.bits() , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }else{
                    optimizedWriteToRGBA(readPointers[0], readPointers[1], readPointers[2], readPointers[3] , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }
                
                //stereo RGBA
                if( channels == 8)
                {
                    if(_ifd->optimizationData[7].fill)
                    {
                        optimizedWriteToRGBAFillA(readPointers[4], readPointers[5], readPointers[6], _ifd->optimizationData[7].fillValue.bits() , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }else{
                        optimizedWriteToRGBA(readPointers[4], readPointers[5], readPointers[6], readPointers[7] , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }
                }
            }
            else {
                throw(IEX_NAMESPACE::LogicExc("IIF mode called with incorrect channel pattern"));
            }
            
            // If we are in NO_OPTIMIZATION mode, this class will never
            // get instantiated, so no need to check for it and duplicate
            // the code.
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}